

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O2

void __thiscall GrpParser::stringDefn(GrpParser *this)

{
  ASTFactory *pAVar1;
  RefAST RVar2;
  bool bVar3;
  int iVar4;
  NoViableAltException *pNVar5;
  RefAST *this_00;
  RefAST *pRVar6;
  RefAST tmp81_AST;
  RefAST tmp78_AST;
  undefined1 local_c0 [8];
  ASTPair currentAST;
  RefAST stringDefn_AST;
  RefCount<Token> local_98;
  RefCount<Token> local_90;
  RefCount<Token> local_88;
  RefToken local_80;
  RefAST local_78;
  RefAST local_70;
  RefToken local_68;
  RefCount<AST> local_60;
  RefAST local_58;
  RefAST local_50;
  RefAST local_48;
  RefCount<Token> local_40;
  RefAST local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  stringDefn_AST = nullAST;
  currentAST.root.ref = (Ref *)0x0;
  currentAST.child.ref = (Ref *)0x0;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  RVar2 = nullAST;
  if (iVar4 == 6) {
    if (nullAST.ref != (Ref *)0x0) {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    tmp78_AST = RVar2;
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_90,this,1);
    pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
    ASTFactory::create((ASTFactory *)&tmp81_AST,(RefToken *)pAVar1);
    RefCount<AST>::operator=(&tmp78_AST,&tmp81_AST);
    RefCount<AST>::~RefCount(&tmp81_AST);
    RefCount<Token>::~RefCount(&local_90);
    if (tmp78_AST.ref != (Ref *)0x0) {
      (tmp78_AST.ref)->count = (tmp78_AST.ref)->count + 1;
    }
    local_58.ref = tmp78_AST.ref;
    ASTFactory::addASTChild(pAVar1,&currentAST,&local_58);
    RefCount<AST>::~RefCount(&local_58);
    Parser::match((Parser *)this,6);
    stringDefn(this);
    local_38.ref = this_00->ref;
    if (local_38.ref != (Ref *)0x0) {
      (local_38.ref)->count = (local_38.ref)->count + 1;
    }
    ASTFactory::addASTChild(pAVar1,&currentAST,&local_38);
    pRVar6 = &local_38;
    while( true ) {
      RefCount<AST>::~RefCount(pRVar6);
      iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      bVar3 = BitSet::member(&_tokenSet_19,iVar4);
      RVar2 = nullAST;
      if (!bVar3) break;
      iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      RVar2 = nullAST;
      if ((iVar4 != 6) && (iVar4 != 0x14)) {
        if (iVar4 == 0x15) {
          if (nullAST.ref != (Ref *)0x0) {
            (nullAST.ref)->count = (nullAST.ref)->count + 1;
          }
          tmp81_AST = RVar2;
          (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_40,this,1);
          ASTFactory::create((ASTFactory *)local_c0,(RefToken *)pAVar1);
          RefCount<AST>::operator=(&tmp81_AST,(RefCount<AST> *)local_c0);
          RefCount<AST>::~RefCount((RefCount<AST> *)local_c0);
          RefCount<Token>::~RefCount(&local_40);
          if (tmp81_AST.ref != (Ref *)0x0) {
            (tmp81_AST.ref)->count = (tmp81_AST.ref)->count + 1;
          }
          local_60.ref = tmp81_AST.ref;
          ASTFactory::addASTChild(pAVar1,&currentAST,&local_60);
          RefCount<AST>::~RefCount(&local_60);
          Parser::match((Parser *)this,0x15);
          RefCount<AST>::~RefCount(&tmp81_AST);
        }
        else if (iVar4 != 0x16) {
          pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
          (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_68,this,1);
          NoViableAltException::NoViableAltException(pNVar5,&local_68);
          __cxa_throw(pNVar5,&NoViableAltException::typeinfo,
                      NoViableAltException::~NoViableAltException);
        }
      }
      stringDefn(this);
      local_70.ref = this_00->ref;
      if (local_70.ref != (Ref *)0x0) {
        (local_70.ref)->count = (local_70.ref)->count + 1;
      }
      ASTFactory::addASTChild(pAVar1,&currentAST,&local_70);
      pRVar6 = &local_70;
    }
    if (nullAST.ref != (Ref *)0x0) {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    tmp81_AST = RVar2;
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_98,this,1);
    ASTFactory::create((ASTFactory *)local_c0,(RefToken *)pAVar1);
    RefCount<AST>::operator=(&tmp81_AST,(RefCount<AST> *)local_c0);
    RefCount<AST>::~RefCount((RefCount<AST> *)local_c0);
    RefCount<Token>::~RefCount(&local_98);
    if (tmp81_AST.ref != (Ref *)0x0) {
      (tmp81_AST.ref)->count = (tmp81_AST.ref)->count + 1;
    }
    local_78.ref = tmp81_AST.ref;
    ASTFactory::addASTChild(pAVar1,&currentAST,&local_78);
    RefCount<AST>::~RefCount(&local_78);
    Parser::match((Parser *)this,7);
    RefCount<AST>::~RefCount(&tmp81_AST);
  }
  else {
    if (iVar4 != 0x14) {
      if (iVar4 != 0x16) {
        pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
        NoViableAltException::NoViableAltException(pNVar5,&local_80);
        __cxa_throw(pNVar5,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      stringFunc(this);
      local_50.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
      if (local_50.ref != (Ref *)0x0) {
        (local_50.ref)->count = (local_50.ref)->count + 1;
      }
      ASTFactory::addASTChild
                (&(this->super_LLkParser).super_Parser.astFactory,&currentAST,&local_50);
      pRVar6 = &local_50;
      goto LAB_0016ef5c;
    }
    if (nullAST.ref != (Ref *)0x0) {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    tmp78_AST = RVar2;
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_88,this,1);
    pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
    ASTFactory::create((ASTFactory *)&tmp81_AST,(RefToken *)pAVar1);
    RefCount<AST>::operator=(&tmp78_AST,&tmp81_AST);
    RefCount<AST>::~RefCount(&tmp81_AST);
    RefCount<Token>::~RefCount(&local_88);
    if (tmp78_AST.ref != (Ref *)0x0) {
      (tmp78_AST.ref)->count = (tmp78_AST.ref)->count + 1;
    }
    local_48.ref = tmp78_AST.ref;
    ASTFactory::addASTChild(pAVar1,&currentAST,&local_48);
    RefCount<AST>::~RefCount(&local_48);
    Parser::match((Parser *)this,0x14);
  }
  pRVar6 = &tmp78_AST;
LAB_0016ef5c:
  RefCount<AST>::~RefCount(pRVar6);
  RefCount<AST>::operator=(&stringDefn_AST,&currentAST.root);
  RefCount<AST>::operator=(this_00,&stringDefn_AST);
  RefCount<AST>::~RefCount(&stringDefn_AST);
  ASTPair::~ASTPair(&currentAST);
  return;
}

Assistant:

void GrpParser::stringDefn() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST stringDefn_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case LIT_STRING:
		{
			RefAST tmp78_AST = nullAST;
			tmp78_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp78_AST);
			match(LIT_STRING);
			break;
		}
		case LITERAL_string:
		{
			stringFunc();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case OP_LPAREN:
		{
			{
			RefAST tmp79_AST = nullAST;
			tmp79_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp79_AST);
			match(OP_LPAREN);
			stringDefn();
			astFactory.addASTChild(currentAST, returnAST);
			{
			do {
				if ((_tokenSet_19.member(LA(1)))) {
					{
					switch ( LA(1)) {
					case OP_COMMA:
					{
						RefAST tmp80_AST = nullAST;
						tmp80_AST = astFactory.create(LT(1));
						astFactory.addASTChild(currentAST, tmp80_AST);
						match(OP_COMMA);
						break;
					}
					case OP_LPAREN:
					case LIT_STRING:
					case LITERAL_string:
					{
						break;
					}
					default:
					{
						throw NoViableAltException(LT(1));
					}
					}
					}
					stringDefn();
					astFactory.addASTChild(currentAST, returnAST);
				}
				else {
					goto _loop57;
				}
				
			} while (true);
			_loop57:;
			}
			RefAST tmp81_AST = nullAST;
			tmp81_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp81_AST);
			match(OP_RPAREN);
			}
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		stringDefn_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_20);
	}
	returnAST = stringDefn_AST;
}